

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_movem_32_re_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar1 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar2 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  uVar4 = (uint)(short)uVar2;
  lVar6 = 0;
  iVar5 = 0;
  do {
    if ((uVar1 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
      uVar2 = m68ki_cpu.dar[lVar6];
      my_fc_handler(m68ki_cpu.s_flag | 1);
      uVar3 = uVar4;
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar3 = pmmu_translate_addr(uVar4);
      }
      m68k_write_memory_32(uVar3 & m68ki_cpu.address_mask,uVar2);
      uVar4 = uVar4 + 4;
      iVar5 = iVar5 + 1;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10);
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar5 << ((byte)m68ki_cpu.cyc_movem_l & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_32_re_aw(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_AW_32();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			m68ki_write_32(ea, REG_DA[i]);
			ea += 4;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_L);
}